

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d9.cpp
# Opt level: O0

Stream * rw::d3d9::writeNativeData
                   (Stream *stream,int32 len,void *object,int32 param_4,int32 param_5)

{
  long lVar1;
  uint val;
  uint32 val_00;
  undefined4 *puVar2;
  uint16 *puVar3;
  long *plVar4;
  uint8 *puVar5;
  undefined4 uVar6;
  uint8 *verts;
  int i_1;
  VertexStream *s;
  uint16 *indices;
  uint32 numElt;
  VertexElement elements [12];
  int32 matid;
  uint32 i;
  InstanceData *inst;
  uint8 *p;
  uint8 *data;
  int32 size;
  InstanceDataHeader *header;
  Geometry *geometry;
  int32 param_4_local;
  int32 param_3_local;
  void *object_local;
  int32 len_local;
  Stream *stream_local;
  
  writeChunkHeader(stream,1,len + -0xc);
  if ((*(long *)((long)object + 0x98) != 0) && (**(int **)((long)object + 0x98) == 9)) {
    Stream::writeU32(stream,9);
    lVar1 = *(long *)((long)object + 0x98);
    val = (uint)*(ushort *)(*(long *)((long)object + 0x90) + 4) * 0x24 + 0x40;
    puVar2 = (undefined4 *)
             mustmalloc_LOC((long)(int)val,0x1000f,
                            "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/d3d/d3d9.cpp line: 254"
                           );
    Stream::writeI32(stream,val);
    *puVar2 = *(undefined4 *)(lVar1 + 4);
    puVar2[1] = *(undefined4 *)(lVar1 + 8);
    puVar2[3] = *(undefined4 *)(lVar1 + 0x18);
    puVar2[0xc] = *(undefined4 *)(lVar1 + 0x50);
    puVar2[0xe] = *(undefined4 *)(lVar1 + 0x60);
    puVar2[0xf] = *(undefined4 *)(lVar1 + 100);
    inst = (InstanceData *)(puVar2 + 0x10);
    _matid = *(uint32 **)(lVar1 + 0x68);
    elements[0xb].type = '\0';
    elements[0xb].method = '\0';
    elements[0xb].usage = '\0';
    elements[0xb].usageIndex = '\0';
    for (; (uint)elements[0xb]._4_4_ < *(uint *)(lVar1 + 8);
        elements[0xb]._4_4_ = elements[0xb]._4_4_ + 1) {
      inst->numIndex = *_matid;
      inst->minVert = _matid[1];
      elements[0xb]._0_4_ =
           MaterialList::findIndex((MaterialList *)((long)object + 0x80),*(Material **)(_matid + 2))
      ;
      *(undefined4 *)&inst->material = elements[0xb]._0_4_;
      *(uint32 *)((long)&inst->material + 4) = _matid[4];
      inst->vertexAlpha = 0;
      *(uint32 *)&inst->field_0x14 = _matid[8];
      *(uint32 *)&inst->vertexShader = _matid[9];
      *(uint32 *)((long)&inst->vertexShader + 4) = _matid[10];
      inst->baseIndex = _matid[0xb];
      inst = (InstanceData *)&inst->numVertices;
      _matid = _matid + 0xc;
    }
    (*stream->_vptr_Stream[3])(stream,puVar2,(ulong)val);
    val_00 = getDeclaration(*(void **)(lVar1 + 0x58),(VertexElement *)&stack0xffffffffffffff38);
    Stream::writeU32(stream,val_00);
    (*stream->_vptr_Stream[3])(stream,&stack0xffffffffffffff38,(ulong)(val_00 << 3));
    puVar3 = d3d::lockIndices(*(void **)(lVar1 + 0x10),0,0,0);
    (*stream->_vptr_Stream[3])(stream,puVar3,(ulong)(uint)(*(int *)(lVar1 + 0x60) << 1));
    d3d::unlockIndices(*(void **)(lVar1 + 0x10));
    for (verts._4_4_ = 0; verts._4_4_ < 2; verts._4_4_ = verts._4_4_ + 1) {
      plVar4 = (long *)(lVar1 + 0x20 + (long)verts._4_4_ * 0x18);
      uVar6 = 0;
      if (*plVar4 != 0) {
        uVar6 = 0xbadeaffe;
      }
      *puVar2 = uVar6;
      puVar2[1] = (int)plVar4[1];
      puVar2[2] = *(undefined4 *)((long)plVar4 + 0xc);
      *(short *)(puVar2 + 3) = (short)plVar4[2];
      *(undefined1 *)((long)puVar2 + 0xe) = *(undefined1 *)((long)plVar4 + 0x12);
      *(undefined1 *)((long)puVar2 + 0xf) = *(undefined1 *)((long)plVar4 + 0x13);
      (*stream->_vptr_Stream[3])(stream,puVar2,0x10);
      if (*plVar4 != 0) {
        puVar5 = d3d::lockVertices((void *)*plVar4,0,0,0);
        (*stream->_vptr_Stream[3])
                  (stream,puVar5,(ulong)(uint)(*(int *)((long)plVar4 + 0xc) * *(int *)(lVar1 + 100))
                  );
        d3d::unlockVertices((void *)*plVar4);
      }
    }
    (*DAT_001660a8)(puVar2);
  }
  return stream;
}

Assistant:

Stream*
writeNativeData(Stream *stream, int32 len, void *object, int32, int32)
{
	ASSERTLITTLE;
	Geometry *geometry = (Geometry*)object;
	writeChunkHeader(stream, ID_STRUCT, len-12);
	if(geometry->instData == nil ||
	   geometry->instData->platform != PLATFORM_D3D9)
		return stream;
	stream->writeU32(PLATFORM_D3D9);
	InstanceDataHeader *header = (InstanceDataHeader*)geometry->instData;
	int32 size = 64 + geometry->meshHeader->numMeshes*36;
	uint8 *data = rwNewT(uint8, size, MEMDUR_FUNCTION | ID_GEOMETRY);
	stream->writeI32(size);

	uint8 *p = data;
	*(uint32*)p = header->serialNumber; p += 4;
	*(uint32*)p = header->numMeshes; p += 4;
	p += 4;		// skip index buffer
	*(uint32*)p = header->primType; p += 4;
	p += 16*2;	// skip vertex streams, they're repeated with the vertex buffers
	*(bool32*)p = header->useOffsets; p += 4;
	p += 4;		// skip vertex declaration
	*(uint32*)p = header->totalNumIndex; p += 4;
	*(uint32*)p = header->totalNumVertex; p += 4;

	InstanceData *inst = header->inst;
	for(uint32 i = 0; i < header->numMeshes; i++){
		*(uint32*)p = inst->numIndex; p += 4;
		*(uint32*)p = inst->minVert; p += 4;
		int32 matid = geometry->matList.findIndex(inst->material);
		*(int32*)p = matid; p += 4;
		*(bool32*)p = inst->vertexAlpha; p += 4;
		*(uint32*)p = 0; p += 4;		// vertex shader
		*(uint32*)p = inst->baseIndex; p += 4;	// not used but meh...
		*(uint32*)p = inst->numVertices; p += 4;
		*(uint32*)p = inst->startIndex; p += 4;
		*(uint32*)p = inst->numPrimitives; p += 4;
		inst++;
	}
	stream->write8(data, size);

	VertexElement elements[NUMDECLELT];
	uint32 numElt = getDeclaration(header->vertexDeclaration, elements);
	stream->writeU32(numElt);
	stream->write8(elements, 8*numElt);

	uint16 *indices = lockIndices(header->indexBuffer, 0, 0, 0);
	stream->write8(indices, 2*header->totalNumIndex);
	unlockIndices(header->indexBuffer);

	VertexStream *s;
	for(int i = 0; i < 2; i++){
		s = &header->vertexStream[i];
		p = data;
		*(uint32*)p = s->vertexBuffer ? 0xbadeaffe : 0; p += 4;
		*(uint32*)p = s->offset; p += 4;
		*(uint32*)p = s->stride; p += 4;
		*(uint16*)p = s->geometryFlags; p += 2;
		*p++ = s->managed;
		*p++ = s->dynamicLock;
		stream->write8(data, 16);

		if(s->vertexBuffer == nil)
			continue;
		uint8 *verts = lockVertices(s->vertexBuffer, 0, 0, D3DLOCK_NOSYSLOCK);
		stream->write8(verts, s->stride*header->totalNumVertex);
		unlockVertices(s->vertexBuffer);
	}

	rwFree(data);
	return stream;
}